

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86XOR(uchar *stream,x86Reg op1,int num)

{
  uchar uVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *start;
  int num_local;
  x86Reg op1_local;
  uchar *stream_local;
  
  if (op1 == rEAX) {
    uVar2 = encodeRex(stream,false,rNONE,rNONE,rEAX);
    puVar3 = stream + uVar2;
    *puVar3 = '5';
    uVar2 = encodeImmDword(puVar3 + 1,num);
    stream_local._4_4_ = ((int)(puVar3 + 1) + uVar2) - (int)stream;
  }
  else {
    uVar2 = encodeRex(stream,false,rNONE,rNONE,op1);
    puVar3 = stream + uVar2;
    *puVar3 = 0x81;
    uVar1 = encodeRegister(op1,'\x06');
    puVar3[1] = uVar1;
    uVar2 = encodeImmDword(puVar3 + 2,num);
    stream_local._4_4_ = ((int)(puVar3 + 2) + uVar2) - (int)stream;
  }
  return stream_local._4_4_;
}

Assistant:

int x86XOR(unsigned char *stream, x86Reg op1, int num)
{
	unsigned char *start = stream;

	if(op1 == rEAX)
	{
		stream += encodeRex(stream, false, rNONE, rNONE, op1);
		*stream++ = 0x35;
		stream += encodeImmDword(stream, num);

		return int(stream - start);
	}

	stream += encodeRex(stream, false, rNONE, rNONE, op1);
	*stream++ = 0x81;
	*stream++ = encodeRegister(op1, 6);
	stream += encodeImmDword(stream, num);

	return int(stream - start);
}